

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M3DImporter.cpp
# Opt level: O3

void __thiscall
Assimp::M3DImporter::convertPose
          (M3DImporter *this,M3DWrapper *m3d,aiMatrix4x4 *m,uint posid,uint orientid)

{
  m3dv_t *pmVar1;
  m3d_t *pmVar2;
  m3dv_t *pmVar3;
  float fVar4;
  
  if (m == (aiMatrix4x4 *)0x0) {
    __assert_fail("m != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x24a,
                  "void Assimp::M3DImporter::convertPose(const M3DWrapper &, aiMatrix4x4 *, unsigned int, unsigned int)"
                 );
  }
  pmVar2 = m3d->m3d_;
  if (pmVar2 != (m3d_t *)0x0) {
    if ((posid != 0xffffffff) && (posid < pmVar2->numvertex)) {
      if (orientid < pmVar2->numvertex) {
        pmVar3 = pmVar2->vertex;
        pmVar1 = pmVar3 + orientid;
        fVar4 = pmVar1->y;
        if (((((pmVar1->x != 0.0) || (NAN(pmVar1->x))) || (fVar4 != 0.0)) ||
            ((NAN(fVar4) || (pmVar1->z < 0.7071065)))) ||
           ((0.7071075 < pmVar1->z || ((pmVar1->w != 0.0 || (NAN(pmVar1->w))))))) {
          fVar4 = fVar4 * fVar4 + pmVar1->z * pmVar1->z;
          fVar4 = 1.0 - (fVar4 + fVar4);
          m->a1 = (float)(~-(uint)(ABS(fVar4) < 1e-07) & (uint)fVar4);
          fVar4 = pmVar1->x * pmVar1->y - pmVar1->w * pmVar1->z;
          fVar4 = fVar4 + fVar4;
          m->a2 = (float)(~-(uint)(ABS(fVar4) < 1e-07) & (uint)fVar4);
          fVar4 = pmVar1->x * pmVar1->z + pmVar1->y * pmVar1->w;
          fVar4 = fVar4 + fVar4;
          m->a3 = (float)(~-(uint)(ABS(fVar4) < 1e-07) & (uint)fVar4);
          fVar4 = pmVar1->x * pmVar1->y + pmVar1->z * pmVar1->w;
          fVar4 = fVar4 + fVar4;
          m->b1 = (float)(~-(uint)(ABS(fVar4) < 1e-07) & (uint)fVar4);
          fVar4 = pmVar1->x * pmVar1->x + pmVar1->z * pmVar1->z;
          fVar4 = 1.0 - (fVar4 + fVar4);
          m->b2 = (float)(~-(uint)(ABS(fVar4) < 1e-07) & (uint)fVar4);
          fVar4 = pmVar1->y * pmVar1->z - pmVar1->w * pmVar1->x;
          fVar4 = fVar4 + fVar4;
          m->b3 = (float)(~-(uint)(ABS(fVar4) < 1e-07) & (uint)fVar4);
          fVar4 = pmVar1->x * pmVar1->z - pmVar1->w * pmVar1->y;
          fVar4 = fVar4 + fVar4;
          m->c1 = (float)(~-(uint)(ABS(fVar4) < 1e-07) & (uint)fVar4);
          fVar4 = pmVar1->y * pmVar1->z + pmVar1->x * pmVar1->w;
          fVar4 = fVar4 + fVar4;
          m->c2 = (float)(~-(uint)(ABS(fVar4) < 1e-07) & (uint)fVar4);
          fVar4 = pmVar1->x * pmVar1->x + pmVar1->y * pmVar1->y;
          fVar4 = 1.0 - (fVar4 + fVar4);
          m->c3 = (float)(~-(uint)(ABS(fVar4) < 1e-07) & (uint)fVar4);
        }
        else {
          m->c1 = 0.0;
          m->c2 = 0.0;
          m->b3 = 0.0;
          m->a3 = 0.0;
          m->c3 = -1.0;
          m->b1 = 0.0;
          m->b2 = -1.0;
          m->a1 = -1.0;
          m->a2 = 0.0;
        }
        m->a4 = pmVar3[posid].x;
        m->b4 = pmVar3[posid].y;
        m->c4 = pmVar3[posid].z;
        m->d1 = 0.0;
        m->d2 = 0.0;
        m->d3 = 0.0;
        m->d4 = 1.0;
        return;
      }
      __assert_fail("orientid != 0xffffffff && orientid < m3d->numvertex",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                    ,0x24d,
                    "void Assimp::M3DImporter::convertPose(const M3DWrapper &, aiMatrix4x4 *, unsigned int, unsigned int)"
                   );
    }
    __assert_fail("posid != 0xffffffff && posid < m3d->numvertex",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x24c,
                  "void Assimp::M3DImporter::convertPose(const M3DWrapper &, aiMatrix4x4 *, unsigned int, unsigned int)"
                 );
  }
  __assert_fail("m3d",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                ,0x24b,
                "void Assimp::M3DImporter::convertPose(const M3DWrapper &, aiMatrix4x4 *, unsigned int, unsigned int)"
               );
}

Assistant:

void M3DImporter::convertPose(const M3DWrapper &m3d, aiMatrix4x4 *m, unsigned int posid, unsigned int orientid) {
	ai_assert(m != nullptr);
	ai_assert(m3d);
	ai_assert(posid != M3D_UNDEF && posid < m3d->numvertex);
	ai_assert(orientid != M3D_UNDEF && orientid < m3d->numvertex);
	m3dv_t *p = &m3d->vertex[posid];
	m3dv_t *q = &m3d->vertex[orientid];

	/* quaternion to matrix. Do NOT use aiQuaternion to aiMatrix3x3, gives bad results */
	if (q->x == 0.0 && q->y == 0.0 && q->z >= 0.7071065 && q->z <= 0.7071075 && q->w == 0.0) {
		m->a2 = m->a3 = m->b1 = m->b3 = m->c1 = m->c2 = 0.0;
		m->a1 = m->b2 = m->c3 = -1.0;
	} else {
		m->a1 = 1 - 2 * (q->y * q->y + q->z * q->z);
		if (m->a1 > -M3D_EPSILON && m->a1 < M3D_EPSILON) m->a1 = 0.0;
		m->a2 = 2 * (q->x * q->y - q->z * q->w);
		if (m->a2 > -M3D_EPSILON && m->a2 < M3D_EPSILON) m->a2 = 0.0;
		m->a3 = 2 * (q->x * q->z + q->y * q->w);
		if (m->a3 > -M3D_EPSILON && m->a3 < M3D_EPSILON) m->a3 = 0.0;
		m->b1 = 2 * (q->x * q->y + q->z * q->w);
		if (m->b1 > -M3D_EPSILON && m->b1 < M3D_EPSILON) m->b1 = 0.0;
		m->b2 = 1 - 2 * (q->x * q->x + q->z * q->z);
		if (m->b2 > -M3D_EPSILON && m->b2 < M3D_EPSILON) m->b2 = 0.0;
		m->b3 = 2 * (q->y * q->z - q->x * q->w);
		if (m->b3 > -M3D_EPSILON && m->b3 < M3D_EPSILON) m->b3 = 0.0;
		m->c1 = 2 * (q->x * q->z - q->y * q->w);
		if (m->c1 > -M3D_EPSILON && m->c1 < M3D_EPSILON) m->c1 = 0.0;
		m->c2 = 2 * (q->y * q->z + q->x * q->w);
		if (m->c2 > -M3D_EPSILON && m->c2 < M3D_EPSILON) m->c2 = 0.0;
		m->c3 = 1 - 2 * (q->x * q->x + q->y * q->y);
		if (m->c3 > -M3D_EPSILON && m->c3 < M3D_EPSILON) m->c3 = 0.0;
	}

	/* set translation */
	m->a4 = p->x;
	m->b4 = p->y;
	m->c4 = p->z;

	m->d1 = 0;
	m->d2 = 0;
	m->d3 = 0;
	m->d4 = 1;
}